

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_library_init.c
# Opt level: O0

void ares_library_cleanup(void)

{
  if ((ares_initialized != 0) && (ares_initialized = ares_initialized - 1, ares_initialized == 0)) {
    ares_init_flags = 0;
    __ares_malloc = default_malloc;
    __ares_realloc = default_realloc;
    __ares_free = default_free;
  }
  return;
}

Assistant:

void ares_library_cleanup(void)
{
  if (!ares_initialized) {
    return;
  }
  ares_initialized--;
  if (ares_initialized) {
    return;
  }

  /* NOTE: ARES_LIB_INIT_WIN32 flag no longer used */

#if defined(ANDROID) || defined(__ANDROID__)
  ares_library_cleanup_android();
#endif

  ares_init_flags = ARES_LIB_INIT_NONE;
  __ares_malloc   = default_malloc;
  __ares_realloc  = default_realloc;
  __ares_free     = default_free;
}